

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_pathmatch.c
# Opt level: O0

wchar_t pm(char *p,char *s,wchar_t flags)

{
  char cVar1;
  char *pcVar2;
  wchar_t wVar3;
  char *pcVar4;
  bool bVar5;
  char *local_30;
  char *end;
  char *pcStack_20;
  wchar_t flags_local;
  char *s_local;
  char *p_local;
  
  pcStack_20 = s;
  if ((*s == '.') && (s[1] == '/')) {
    pcStack_20 = pm_slashskip(s + 1);
  }
  s_local = p;
  if ((*p == '.') && (p[1] == '/')) {
    s_local = pm_slashskip(p + 1);
  }
  do {
    cVar1 = *s_local;
    if (cVar1 == '\0') {
      if (*pcStack_20 == '/') {
        if ((flags & 2U) != 0) {
          return L'\x01';
        }
        pcStack_20 = pm_slashskip(pcStack_20);
      }
      return (uint)(*pcStack_20 == '\0');
    }
    if (cVar1 == '$') {
      if ((s_local[1] == '\0') && ((flags & 2U) != 0)) {
        pcVar4 = pm_slashskip(pcStack_20);
        return (uint)(*pcVar4 == '\0');
      }
LAB_00172f1b:
      if (*s_local != *pcStack_20) {
        return L'\0';
      }
    }
    else {
      if (cVar1 == '*') {
        for (; *s_local == '*'; s_local = s_local + 1) {
        }
        if (*s_local == '\0') {
          p_local._4_4_ = L'\x01';
        }
        else {
          for (; *pcStack_20 != '\0'; pcStack_20 = pcStack_20 + 1) {
            wVar3 = __archive_pathmatch(s_local,pcStack_20,flags);
            if (wVar3 != L'\0') {
              return L'\x01';
            }
          }
          p_local._4_4_ = L'\0';
        }
        return p_local._4_4_;
      }
      if (cVar1 == '/') {
        if ((*pcStack_20 != '/') && (*pcStack_20 != '\0')) {
          return L'\0';
        }
        pcVar4 = pm_slashskip(s_local);
        pcStack_20 = pm_slashskip(pcStack_20);
        if ((*pcVar4 == '\0') && ((flags & 2U) != 0)) {
          return L'\x01';
        }
        s_local = pcVar4 + -1;
        pcStack_20 = pcStack_20 + -1;
      }
      else if (cVar1 == '?') {
        if (*pcStack_20 == '\0') {
          return L'\0';
        }
      }
      else {
        pcVar4 = s_local;
        if (cVar1 == '[') {
          while( true ) {
            pcVar2 = pcVar4;
            local_30 = pcVar2 + 1;
            bVar5 = false;
            if (*local_30 != '\0') {
              bVar5 = *local_30 != ']';
            }
            if (!bVar5) break;
            pcVar4 = local_30;
            if ((*local_30 == '\\') && (pcVar4 = local_30, pcVar2[2] != '\0')) {
              pcVar4 = pcVar2 + 2;
            }
          }
          if (*local_30 == ']') {
            wVar3 = pm_list(s_local + 1,local_30,*pcStack_20,flags);
            if (wVar3 == L'\0') {
              return L'\0';
            }
            s_local = local_30;
          }
          else if (*s_local != *pcStack_20) {
            return L'\0';
          }
        }
        else {
          if (cVar1 != '\\') goto LAB_00172f1b;
          if (s_local[1] == '\0') {
            if (*pcStack_20 != '\\') {
              return L'\0';
            }
          }
          else {
            s_local = s_local + 1;
            if (*s_local != *pcStack_20) {
              return L'\0';
            }
          }
        }
      }
    }
    s_local = s_local + 1;
    pcStack_20 = pcStack_20 + 1;
  } while( true );
}

Assistant:

static int
pm(const char *p, const char *s, int flags)
{
	const char *end;

	/*
	 * Ignore leading './', './/', '././', etc.
	 */
	if (s[0] == '.' && s[1] == '/')
		s = pm_slashskip(s + 1);
	if (p[0] == '.' && p[1] == '/')
		p = pm_slashskip(p + 1);

	for (;;) {
		switch (*p) {
		case '\0':
			if (s[0] == '/') {
				if (flags & PATHMATCH_NO_ANCHOR_END)
					return (1);
				/* "dir" == "dir/" == "dir/." */
				s = pm_slashskip(s);
			}
			return (*s == '\0');
		case '?':
			/* ? always succeeds, unless we hit end of 's' */
			if (*s == '\0')
				return (0);
			break;
		case '*':
			/* "*" == "**" == "***" ... */
			while (*p == '*')
				++p;
			/* Trailing '*' always succeeds. */
			if (*p == '\0')
				return (1);
			while (*s) {
				if (archive_pathmatch(p, s, flags))
					return (1);
				++s;
			}
			return (0);
		case '[':
			/*
			 * Find the end of the [...] character class,
			 * ignoring \] that might occur within the class.
			 */
			end = p + 1;
			while (*end != '\0' && *end != ']') {
				if (*end == '\\' && end[1] != '\0')
					++end;
				++end;
			}
			if (*end == ']') {
				/* We found [...], try to match it. */
				if (!pm_list(p + 1, end, *s, flags))
					return (0);
				p = end; /* Jump to trailing ']' char. */
				break;
			} else
				/* No final ']', so just match '['. */
				if (*p != *s)
					return (0);
			break;
		case '\\':
			/* Trailing '\\' matches itself. */
			if (p[1] == '\0') {
				if (*s != '\\')
					return (0);
			} else {
				++p;
				if (*p != *s)
					return (0);
			}
			break;
		case '/':
			if (*s != '/' && *s != '\0')
				return (0);
			/* Note: pattern "/\./" won't match "/";
			 * pm_slashskip() correctly stops at backslash. */
			p = pm_slashskip(p);
			s = pm_slashskip(s);
			if (*p == '\0' && (flags & PATHMATCH_NO_ANCHOR_END))
				return (1);
			--p; /* Counteract the increment below. */
			--s;
			break;
		case '$':
			/* '$' is special only at end of pattern and only
			 * if PATHMATCH_NO_ANCHOR_END is specified. */
			if (p[1] == '\0' && (flags & PATHMATCH_NO_ANCHOR_END)){
				/* "dir" == "dir/" == "dir/." */
				return (*pm_slashskip(s) == '\0');
			}
			/* Otherwise, '$' is not special. */
			/* FALL THROUGH */
		default:
			if (*p != *s)
				return (0);
			break;
		}
		++p;
		++s;
	}
}